

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

AssertionResult * __thiscall
testing::internal::CmpHelperOpFailure<std::__cxx11::string,std::__cxx11::string>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expr1,char *expr2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val2,char *op)

{
  AssertionResult *pAVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  char *local_80;
  internal *local_78;
  string local_70;
  string local_50;
  AssertionResult local_30;
  
  local_88 = val2;
  local_80 = expr1;
  local_78 = this;
  testing::AssertionFailure();
  pAVar1 = AssertionResult::operator<<(&local_30,(char (*) [12])"Expected: (");
  pAVar1 = AssertionResult::operator<<(pAVar1,(char **)&local_78);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [3])") ");
  pAVar1 = AssertionResult::operator<<(pAVar1,(char **)&local_88);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [3])0x112d63);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_80);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [12])"), actual: ");
  PrintToString<std::__cxx11::string>(&local_50,(testing *)expr2,value);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_50);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [5])" vs ");
  PrintToString<std::__cxx11::string>(&local_70,(testing *)val1,value_00);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_70);
  testing::AssertionResult::AssertionResult(__return_storage_ptr__,pAVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return __return_storage_ptr__;
}

Assistant:

AssertionResult CmpHelperOpFailure(const char* expr1, const char* expr2,
                                   const T1& val1, const T2& val2,
                                   const char* op) {
  return AssertionFailure()
         << "Expected: (" << expr1 << ") " << op << " (" << expr2
         << "), actual: " << FormatForComparisonFailureMessage(val1, val2)
         << " vs " << FormatForComparisonFailureMessage(val2, val1);
}